

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O0

void __thiscall smf::MidiFile::clearSequence(MidiFile *this,int track)

{
  int iVar1;
  MidiEventList *this_00;
  ostream *poVar2;
  int track_local;
  MidiFile *this_local;
  
  if ((-1 < track) && (iVar1 = getTrackCount(this), track < iVar1)) {
    this_00 = operator[](this,track);
    MidiEventList::clearSequence(this_00);
    return;
  }
  poVar2 = std::operator<<((ostream *)&std::cerr,"Warning: track ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,track);
  poVar2 = std::operator<<(poVar2," does not exist.");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void MidiFile::clearSequence(int track) {
	if ((track >= 0) && (track < getTrackCount())) {
		operator[](track).clearSequence();
	} else {
		std::cerr << "Warning: track " << track << " does not exist." << std::endl;
	}
}